

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O3

Bigint * diff(Bigint *a,Bigint *b)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  Bigint *pBVar4;
  Bigint *pBVar5;
  int iVar6;
  uint32 *puVar7;
  uint32 *puVar8;
  uint uVar9;
  uint32 *puVar10;
  ulong uVar11;
  
  uVar9 = a->wds - b->wds;
  if (uVar9 == 0) {
    lVar3 = (long)b->wds * 4 + 0x1c;
    do {
      uVar9 = *(uint *)((long)a->x + lVar3 + -0x20);
      uVar1 = *(uint *)((long)b->x + lVar3 + -0x20);
      if (uVar9 != uVar1) {
        uVar9 = -(uint)(uVar9 < uVar1) | 1;
        goto LAB_0010c1d7;
      }
      lVar3 = lVar3 + -4;
    } while (0x1c < lVar3);
    pBVar4 = (Bigint *)
             __ckd_malloc__(0x20,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/dtoa.c"
                            ,0x1a9);
    if (pBVar4 != (Bigint *)0x0) {
      pBVar4->k = 0;
      pBVar4->maxwds = 1;
      pBVar4->sign = 0;
      pBVar4->wds = 1;
      pBVar4->x[0] = 0;
      return pBVar4;
    }
  }
  else {
LAB_0010c1d7:
    pBVar4 = a;
    if ((int)uVar9 < 0) {
      pBVar4 = b;
    }
    pBVar5 = Balloc(pBVar4->k);
    if (pBVar5 != (Bigint *)0x0) {
      if ((int)uVar9 < 0) {
        b = a;
      }
      pBVar5->sign = uVar9 >> 0x1f;
      iVar6 = pBVar4->wds;
      iVar2 = b->wds;
      puVar8 = b->x;
      puVar7 = pBVar5->x;
      uVar11 = 0;
      puVar10 = pBVar4->x;
      do {
        uVar9 = *puVar8;
        uVar1 = *puVar10;
        puVar10 = puVar10 + 1;
        puVar8 = puVar8 + 1;
        lVar3 = (ulong)uVar1 - (uVar9 + uVar11);
        *puVar7 = (uint32)lVar3;
        uVar11 = (ulong)((uint)((ulong)lVar3 >> 0x20) & 1);
        puVar7 = puVar7 + 1;
      } while (puVar8 < b->x + iVar2);
      for (; puVar10 < pBVar4->x + iVar6; puVar10 = puVar10 + 1) {
        lVar3 = *puVar10 - uVar11;
        uVar11 = (ulong)((uint)((ulong)lVar3 >> 0x20) & 1);
        *puVar7 = (uint32)lVar3;
        puVar7 = puVar7 + 1;
      }
      iVar6 = iVar6 + 1;
      do {
        puVar7 = puVar7 + -1;
        iVar6 = iVar6 + -1;
      } while (*puVar7 == 0);
      pBVar5->wds = iVar6;
      return pBVar5;
    }
  }
  return (Bigint *)0x0;
}

Assistant:

static Bigint *
diff(Bigint *a, Bigint *b)
{
    Bigint *c;
    int i, wa, wb;
    ULong *xa, *xae, *xb, *xbe, *xc;
#ifdef ULLong
    ULLong borrow, y;
#else
    ULong borrow, y;
    ULong z;
#endif

    i = cmp(a,b);
    if (!i) {
        c = Balloc(0);
        if (c == NULL)
            return NULL;
        c->wds = 1;
        c->x[0] = 0;
        return c;
    }
    if (i < 0) {
        c = a;
        a = b;
        b = c;
        i = 1;
    }
    else
        i = 0;
    c = Balloc(a->k);
    if (c == NULL)
        return NULL;
    c->sign = i;
    wa = a->wds;
    xa = a->x;
    xae = xa + wa;
    wb = b->wds;
    xb = b->x;
    xbe = xb + wb;
    xc = c->x;
    borrow = 0;
#ifdef ULLong
    do {
        y = (ULLong)*xa++ - *xb++ - borrow;
        borrow = y >> 32 & (ULong)1;
        *xc++ = (ULong)(y & FFFFFFFF);
    }
    while(xb < xbe);
    while(xa < xae) {
        y = *xa++ - borrow;
        borrow = y >> 32 & (ULong)1;
        *xc++ = (ULong)(y & FFFFFFFF);
    }
#else
    do {
        y = (*xa & 0xffff) - (*xb & 0xffff) - borrow;
        borrow = (y & 0x10000) >> 16;
        z = (*xa++ >> 16) - (*xb++ >> 16) - borrow;
        borrow = (z & 0x10000) >> 16;
        Storeinc(xc, z, y);
    }
    while(xb < xbe);
    while(xa < xae) {
        y = (*xa & 0xffff) - borrow;
        borrow = (y & 0x10000) >> 16;
        z = (*xa++ >> 16) - borrow;
        borrow = (z & 0x10000) >> 16;
        Storeinc(xc, z, y);
    }
#endif
    while(!*--xc)
        wa--;
    c->wds = wa;
    return c;
}